

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O2

void __thiscall
SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::
read_chunked_transfer_encoded_chunk
          (ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
          *session,shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *chunks_streambuf,
          unsigned_long length)

{
  element_type *peVar1;
  element_type *peVar2;
  char *pcVar3;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  error_code ec;
  ostream tmp_stream;
  _Head_base<0UL,_char_*,_false> local_250;
  undefined1 local_248 [8];
  error_category *local_240;
  char local_138 [8];
  ios_base local_130 [264];
  
  std::ostream::ostream
            (local_138,
             &((chunks_streambuf->
               super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->super_streambuf);
  if (length != 0) {
    pcVar3 = (char *)operator_new__(length);
    local_250._M_head_impl = pcVar3;
    std::istream::read((char *)&((((session->
                                   super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->response).
                                 super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->content,(long)pcVar3);
    std::ostream::write(local_138,(long)pcVar3);
    peVar1 = (chunks_streambuf->
             super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if (*(long *)&peVar1->field_0x28 - *(long *)&peVar1->field_0x10 == peVar1->max_size_) {
      peVar2 = (session->
               super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      local_240 = (error_category *)std::_V2::generic_category();
      local_248._0_4_ = 0x5a;
      std::
      function<void_(const_std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>_&,_const_std::error_code_&)>
      ::operator()(&peVar2->callback,&peVar2->connection,(error_code *)local_248);
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_250);
      goto LAB_001568b8;
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_250);
  }
  std::istream::get();
  std::istream::get();
  if (length == 0) {
    peVar1 = (chunks_streambuf->
             super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if (*(long *)&peVar1->field_0x28 != *(long *)&peVar1->field_0x10) {
      std::ostream::ostream
                (local_248,
                 (streambuf *)
                 (((session->
                   super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->response).
                 super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      std::ostream::operator<<
                (local_248,
                 &((chunks_streambuf->
                   super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->super_streambuf);
      std::ios_base::~ios_base((ios_base *)&local_240);
    }
    local_248._0_4_ = 0;
    local_240 = (error_category *)std::_V2::system_category();
    peVar2 = (session->
             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    std::
    function<void_(const_std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection>_&,_const_std::error_code_&)>
    ::operator()(&peVar2->callback,&peVar2->connection,(error_code *)local_248);
  }
  else {
    read_chunked_transfer_encoded(this,session,chunks_streambuf);
  }
LAB_001568b8:
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void read_chunked_transfer_encoded_chunk(const std::shared_ptr<Session> &session, const std::shared_ptr<asio::streambuf> &chunks_streambuf, unsigned long length) {
      std::ostream tmp_stream(chunks_streambuf.get());
      if(length > 0) {
        std::unique_ptr<char[]> buffer(new char[length]);
        session->response->content.read(buffer.get(), static_cast<std::streamsize>(length));
        tmp_stream.write(buffer.get(), static_cast<std::streamsize>(length));
        if(chunks_streambuf->size() == chunks_streambuf->max_size()) {
          session->callback(session->connection, make_error_code::make_error_code(errc::message_size));
          return;
        }
      }

      // Remove "\r\n"
      session->response->content.get();
      session->response->content.get();

      if(length > 0)
        read_chunked_transfer_encoded(session, chunks_streambuf);
      else {
        if(chunks_streambuf->size() > 0) {
          std::ostream ostream(&session->response->streambuf);
          ostream << chunks_streambuf.get();
        }
        error_code ec;
        session->callback(session->connection, ec);
      }
    }